

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  time_t fileSize_00;
  bool bVar1;
  uint uVar2;
  char *pcVar3;
  size_type sVar4;
  ostream *poVar5;
  ulong uVar6;
  size_t sVar7;
  runtime_error *prVar8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar9;
  string *psVar10;
  string *password;
  size_t sVar11;
  value_type *pvVar12;
  basic_ostream<char,_std::char_traits<char>_> *pbVar13;
  reference p;
  error_category *peVar14;
  float fVar15;
  error_code ec;
  bool local_749;
  float local_6c0;
  byte local_592;
  bool local_529;
  exception *ex;
  undefined1 auStack_478 [8];
  error_code systemError;
  float transferSpeed;
  float elapsed;
  error_category *local_420;
  time_t uploadTime;
  uintmax_t fileSize;
  type filePath;
  time_t uploadTimeThreshold;
  time_t availableUploadTime;
  reference local_3c0;
  value_type *path;
  size_t maxBacklogItems;
  duration<long,_std::ratio<1L,_1000L>_> local_3a8;
  path local_3a0;
  undefined1 local_380 [8];
  deque<boost::filesystem::path,_std::allocator<boost::filesystem::path>_> paths;
  CURLSession session;
  path local_318;
  path local_2f8;
  allocator local_2d1;
  key_type local_2d0;
  undefined1 local_2b0 [8];
  Configuration cfg;
  int exitResult;
  error *e;
  key_type local_1e8;
  function1<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_1c8;
  basic_parsed_options<char> local_1a0;
  variables_map local_178 [8];
  variables_map vm;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
  local_168 [144];
  undefined8 local_d8 [3];
  allocator local_b9;
  string local_b8 [32];
  options_description local_98 [8];
  options_description desc;
  char **argv_local;
  int argc_local;
  
  curl_global_init(3);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b8,"Options",&local_b9);
  boost::program_options::options_description::options_description
            (local_98,local_b8,
             (uint)boost::program_options::options_description::m_default_line_length,
             (uint)boost::program_options::options_description::m_default_line_length >> 1);
  std::__cxx11::string::~string(local_b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_b9);
  local_d8[0] = boost::program_options::options_description::add_options();
  pcVar3 = (char *)boost::program_options::options_description_easy_init::operator()
                             ((char *)local_d8,"help");
  boost::program_options::options_description_easy_init::operator()(pcVar3,"verbose,v");
  boost::program_options::variables_map::variables_map(local_178);
  local_1c8.super_function_base.functor._8_8_ = 0;
  local_1c8.super_function_base.functor._16_8_ = 0;
  local_1c8.super_function_base.vtable = (vtable_base *)0x0;
  local_1c8.super_function_base.functor.members.obj_ptr = (obj_ptr_t)0x0;
  boost::
  function1<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  ::function1(&local_1c8);
  boost::program_options::parse_command_line<char>(&local_1a0,argc,argv,local_98,0,&local_1c8);
  boost::program_options::store((basic_parsed_options *)&local_1a0,local_178,false);
  boost::program_options::basic_parsed_options<char>::~basic_parsed_options(&local_1a0);
  boost::
  function1<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  ::~function1(&local_1c8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1e8,"help",(allocator *)((long)&e + 7));
  sVar4 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
          ::count(local_168,&local_1e8);
  std::__cxx11::string::~string((string *)&local_1e8);
  std::allocator<char>::~allocator((allocator<char> *)((long)&e + 7));
  if (sVar4 != 0) {
    poVar5 = std::operator<<((ostream *)&std::cout,*argv);
    poVar5 = std::operator<<(poVar5,":");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    poVar5 = (ostream *)boost::program_options::operator<<(poVar5,local_98);
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    e._0_4_ = 1;
    boost::program_options::variables_map::~variables_map(local_178);
    boost::program_options::options_description::~options_description(local_98);
    return 0;
  }
  boost::program_options::notify(local_178);
  cfg.m_extensions.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
  Configuration::Configuration((Configuration *)local_2b0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_2d0,"verbose",&local_2d1);
  sVar4 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
          ::count(local_168,&local_2d0);
  local_529 = true;
  if (sVar4 == 0) {
    local_529 = Configuration::debug((Configuration *)local_2b0);
  }
  std::__cxx11::string::~string((string *)&local_2d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_2d1);
  if (local_529 != false) {
    Configuration::verbose((Configuration *)local_2b0,true);
  }
  Configuration::base_dir_abi_cxx11_((Configuration *)local_2b0);
  uVar6 = std::__cxx11::string::empty();
  if ((uVar6 & 1) != 0) {
    prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar8,"Base dir cannot be empty");
    __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  Configuration::base_url_abi_cxx11_((Configuration *)local_2b0);
  uVar6 = std::__cxx11::string::empty();
  if ((uVar6 & 1) != 0) {
    prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar8,"Base URL cannot be empty");
    __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  Configuration::username_abi_cxx11_((Configuration *)local_2b0);
  uVar6 = std::__cxx11::string::empty();
  if ((uVar6 & 1) == 0) {
    Configuration::password_abi_cxx11_((Configuration *)local_2b0);
    uVar6 = std::__cxx11::string::empty();
    if ((uVar6 & 1) != 0) {
      prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar8,"Username provided without a password");
      __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  sVar7 = Configuration::segment_duration((Configuration *)local_2b0);
  if (sVar7 == 0) {
    prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar8,"Segment duration not specified");
    __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  pvVar9 = Configuration::extensions_abi_cxx11_((Configuration *)local_2b0);
  bVar1 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty(pvVar9);
  if (bVar1) {
    prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar8,"Extensions list cannot be empty");
    __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  psVar10 = Configuration::base_dir_abi_cxx11_((Configuration *)local_2b0);
  boost::filesystem::path::path(&local_2f8,psVar10);
  bVar1 = boost::filesystem::exists(&local_2f8);
  local_592 = 1;
  if (bVar1) {
    psVar10 = Configuration::base_dir_abi_cxx11_((Configuration *)local_2b0);
    boost::filesystem::path::path(&local_318,psVar10);
    bVar1 = boost::filesystem::is_directory(&local_318);
    local_592 = bVar1 ^ 0xff;
    boost::filesystem::path::~path(&local_318);
  }
  boost::filesystem::path::~path(&local_2f8);
  if ((local_592 & 1) != 0) {
    prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar8,"Base directory doesn\'t exist or is not a directory");
    __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  poVar5 = std::operator<<((ostream *)&std::cout,"Camera streamer is running");
  std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  bVar1 = Configuration::verbose((Configuration *)local_2b0);
  if (bVar1) {
    poVar5 = std::operator<<((ostream *)&std::cout,"* Base directory:      ");
    psVar10 = Configuration::base_dir_abi_cxx11_((Configuration *)local_2b0);
    poVar5 = std::operator<<(poVar5,(string *)psVar10);
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    poVar5 = std::operator<<((ostream *)&std::cout,"* Base URL:            ");
    psVar10 = Configuration::base_url_abi_cxx11_((Configuration *)local_2b0);
    poVar5 = std::operator<<(poVar5,(string *)psVar10);
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    poVar5 = std::operator<<((ostream *)&std::cout,"* Backlog duration:    ");
    sVar7 = Configuration::max_backlog_total_segment_duration((Configuration *)local_2b0);
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,sVar7);
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  }
  CURLSession::CURLSession
            ((CURLSession *)
             &paths.
              super__Deque_base<boost::filesystem::path,_std::allocator<boost::filesystem::path>_>.
              _M_impl.super__Deque_impl_data._M_finish._M_node);
  bVar1 = Configuration::debug((Configuration *)local_2b0);
  CURLSession::set_verbose
            ((CURLSession *)
             &paths.
              super__Deque_base<boost::filesystem::path,_std::allocator<boost::filesystem::path>_>.
              _M_impl.super__Deque_impl_data._M_finish._M_node,bVar1);
  Configuration::username_abi_cxx11_((Configuration *)local_2b0);
  uVar6 = std::__cxx11::string::empty();
  if ((uVar6 & 1) == 0) {
    Configuration::password_abi_cxx11_((Configuration *)local_2b0);
    uVar6 = std::__cxx11::string::empty();
    if ((uVar6 & 1) == 0) {
      psVar10 = Configuration::username_abi_cxx11_((Configuration *)local_2b0);
      password = Configuration::password_abi_cxx11_((Configuration *)local_2b0);
      CURLSession::set_credentials
                ((CURLSession *)
                 &paths.
                  super__Deque_base<boost::filesystem::path,_std::allocator<boost::filesystem::path>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_node,psVar10,password);
    }
  }
  do {
    psVar10 = Configuration::base_dir_abi_cxx11_((Configuration *)local_2b0);
    boost::filesystem::path::path(&local_3a0,psVar10);
    pvVar9 = Configuration::extensions_abi_cxx11_((Configuration *)local_2b0);
    find_upload_files((deque<boost::filesystem::path,_std::allocator<boost::filesystem::path>_> *)
                      local_380,&local_3a0,pvVar9);
    boost::filesystem::path::~path(&local_3a0);
    bVar1 = std::deque<boost::filesystem::path,_std::allocator<boost::filesystem::path>_>::empty
                      ((deque<boost::filesystem::path,_std::allocator<boost::filesystem::path>_> *)
                       local_380);
    if (bVar1) {
      maxBacklogItems._4_4_ = 200;
      std::chrono::duration<long,std::ratio<1l,1000l>>::duration<int,void>
                ((duration<long,std::ratio<1l,1000l>> *)&local_3a8,
                 (int *)((long)&maxBacklogItems + 4));
      std::this_thread::sleep_for<long,std::ratio<1l,1000l>>(&local_3a8);
      e._0_4_ = 2;
    }
    else {
      sVar7 = Configuration::max_backlog_total_segment_duration((Configuration *)local_2b0);
      sVar11 = Configuration::segment_duration((Configuration *)local_2b0);
      path = (value_type *)(sVar7 / sVar11);
      if (path != (value_type *)0x0) {
        while (pvVar12 = (value_type *)
                         std::
                         deque<boost::filesystem::path,_std::allocator<boost::filesystem::path>_>::
                         size((deque<boost::filesystem::path,_std::allocator<boost::filesystem::path>_>
                               *)local_380), path < pvVar12) {
          local_3c0 = std::deque<boost::filesystem::path,_std::allocator<boost::filesystem::path>_>
                      ::back((deque<boost::filesystem::path,_std::allocator<boost::filesystem::path>_>
                              *)local_380);
          bVar1 = Configuration::verbose((Configuration *)local_2b0);
          if (bVar1) {
            boost::filesystem::path::filename();
            pbVar13 = boost::filesystem::operator<<
                                ((basic_ostream<char,_std::char_traits<char>_> *)&std::cout,
                                 (path *)&availableUploadTime);
            poVar5 = std::operator<<((ostream *)pbVar13,": Removing from backlog");
            std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
            boost::filesystem::path::~path((path *)&availableUploadTime);
          }
          boost::filesystem::remove((char *)local_3c0);
          std::deque<boost::filesystem::path,_std::allocator<boost::filesystem::path>_>::pop_back
                    ((deque<boost::filesystem::path,_std::allocator<boost::filesystem::path>_> *)
                     local_380);
        }
      }
      sVar7 = Configuration::segment_duration((Configuration *)local_2b0);
      uploadTimeThreshold = sVar7 * 1000000;
      filePath.m_pathname.field_2._8_8_ = uploadTimeThreshold / 10;
      do {
        p = std::deque<boost::filesystem::path,_std::allocator<boost::filesystem::path>_>::front
                      ((deque<boost::filesystem::path,_std::allocator<boost::filesystem::path>_> *)
                       local_380);
        boost::filesystem::path::path((path *)&fileSize,p);
        std::deque<boost::filesystem::path,_std::allocator<boost::filesystem::path>_>::pop_front
                  ((deque<boost::filesystem::path,_std::allocator<boost::filesystem::path>_> *)
                   local_380);
        uploadTime = boost::filesystem::file_size((path *)&fileSize);
        local_420 = (error_category *)0x0;
        bVar1 = Configuration::verbose((Configuration *)local_2b0);
        if (bVar1) {
          boost::filesystem::path::filename();
          pbVar13 = boost::filesystem::operator<<
                              ((basic_ostream<char,_std::char_traits<char>_> *)&std::cout,
                               (path *)&transferSpeed);
          std::operator<<((ostream *)pbVar13,": Uploading... ");
          boost::filesystem::path::~path((path *)&transferSpeed);
          std::ostream::flush();
        }
        fileSize_00 = uploadTime;
        psVar10 = Configuration::base_url_abi_cxx11_((Configuration *)local_2b0);
        bVar1 = CURLSession::upload_file
                          ((CURLSession *)
                           &paths.
                            super__Deque_base<boost::filesystem::path,_std::allocator<boost::filesystem::path>_>
                            ._M_impl.super__Deque_impl_data._M_finish._M_node,(path *)&fileSize,
                           fileSize_00,psVar10,(time_t *)&local_420);
        if (bVar1) {
          uploadTimeThreshold = uploadTimeThreshold - (long)local_420;
          peVar14 = local_420;
          bVar1 = Configuration::verbose((Configuration *)local_2b0);
          if (bVar1) {
            fVar15 = (float)(long)local_420;
            peVar14 = (error_category *)((ulong)((uint)uploadTime & 1) | (ulong)uploadTime >> 1);
            local_6c0 = (float)(ulong)uploadTime;
            poVar5 = std::operator<<((ostream *)&std::cout,"Done. Transfer speed: ");
            poVar5 = (ostream *)
                     std::ostream::operator<<(poVar5,(local_6c0 / (fVar15 / 1e+06)) * 0.0009765625);
            poVar5 = std::operator<<(poVar5," kB/s (");
            poVar5 = (ostream *)std::ostream::operator<<(poVar5,uploadTime);
            poVar5 = std::operator<<(poVar5," bytes in ");
            poVar5 = (ostream *)std::ostream::operator<<(poVar5,fVar15 / 1e+06);
            poVar5 = std::operator<<(poVar5," second(s))");
            std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
            bVar1 = Configuration::debug((Configuration *)local_2b0);
            if (bVar1) {
              if (uploadTimeThreshold <= (long)filePath.m_pathname.field_2._8_8_) {
                poVar5 = std::operator<<((ostream *)&std::cout,
                                         "No enough time left for current window, refreshing upload file list"
                                        );
                std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
              }
              boost::filesystem::path::filename();
              pbVar13 = boost::filesystem::operator<<
                                  ((basic_ostream<char,_std::char_traits<char>_> *)&std::cout,
                                   (path *)&systemError.cat_);
              std::operator<<((ostream *)pbVar13,": Removing file from disk... ");
              boost::filesystem::path::~path((path *)&systemError.cat_);
            }
          }
          boost::system::error_code::error_code((error_code *)auStack_478);
          uVar2 = boost::filesystem::remove((filesystem *)&fileSize,auStack_478);
          if ((uVar2 & 1) == 0) {
            bVar1 = Configuration::verbose((Configuration *)local_2b0);
            if (bVar1) {
              poVar5 = std::operator<<((ostream *)&std::cout,
                                       "Failed to remove uploaded file from disk (");
              ec.cat_ = peVar14;
              ec.val_ = systemError.val_;
              ec.failed_ = systemError.failed_;
              ec._5_3_ = systemError._5_3_;
              pbVar13 = boost::system::operator<<
                                  ((system *)poVar5,
                                   (basic_ostream<char,_std::char_traits<char>_> *)auStack_478,ec);
              poVar5 = std::operator<<((ostream *)pbVar13,")");
              std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
            }
          }
          else {
            bVar1 = Configuration::debug((Configuration *)local_2b0);
            if (bVar1) {
              poVar5 = std::operator<<((ostream *)&std::cout,"Done");
              std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
            }
          }
          e._0_4_ = 0;
        }
        else {
          bVar1 = Configuration::debug((Configuration *)local_2b0);
          if (bVar1) {
            poVar5 = std::operator<<((ostream *)&std::cout,
                                     "Failed to upload file, breaking from loop.");
            std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
          }
          e._0_4_ = 6;
        }
        boost::filesystem::path::~path((path *)&fileSize);
        if ((int)e != 0) break;
        bVar1 = std::deque<boost::filesystem::path,_std::allocator<boost::filesystem::path>_>::empty
                          ((deque<boost::filesystem::path,_std::allocator<boost::filesystem::path>_>
                            *)local_380);
        local_749 = !bVar1 && (long)filePath.m_pathname.field_2._8_8_ < uploadTimeThreshold;
      } while (local_749);
      e._0_4_ = 0;
    }
    std::deque<boost::filesystem::path,_std::allocator<boost::filesystem::path>_>::~deque
              ((deque<boost::filesystem::path,_std::allocator<boost::filesystem::path>_> *)local_380
              );
  } while( true );
}

Assistant:

int main(int argc, char** argv)
{
    curl_global_init(CURL_GLOBAL_ALL);

    po::options_description desc("Options");
    desc.add_options()
        ("help", "Print help messages")
        ("verbose,v", "Make output verbose");

    po::variables_map vm;

    try
    {
        po::store(po::parse_command_line(argc, argv, desc), vm);

        if (vm.count("help"))
        {
            std::cout << argv[0] << ":" << std::endl << desc << std::endl;
            return 0;
        }

        po::notify(vm);
    }
    catch (const po::error& e)
    {
        std::cerr << "Error: " << e.what() << std::endl << std::endl;
        std::cerr << desc << std::endl;
        return 1;
    }

    int exitResult = 0;

    try
    {
        Configuration cfg;

        if (vm.count("verbose") || cfg.debug())
        {
            cfg.verbose(true);
        }

        if (cfg.base_dir().empty())
        {
            throw std::runtime_error("Base dir cannot be empty");
        }

        if (cfg.base_url().empty())
        {
            throw std::runtime_error("Base URL cannot be empty");
        }

        if (!cfg.username().empty() && cfg.password().empty())
        {
            throw std::runtime_error("Username provided without a password");
        }

        if (!cfg.segment_duration())
        {
            throw std::runtime_error("Segment duration not specified");
        }

        if (cfg.extensions().empty())
        {
            throw std::runtime_error("Extensions list cannot be empty");
        }

        if (!fs::exists(cfg.base_dir()) || !fs::is_directory(cfg.base_dir()))
        {
            throw std::runtime_error("Base directory doesn't exist or is not a directory");
        }

        std::cout << "Camera streamer is running" << std::endl;

        if (cfg.verbose())
        {
            std::cout << "* Base directory:      " << cfg.base_dir() << std::endl;
            std::cout << "* Base URL:            " << cfg.base_url() << std::endl;
            std::cout << "* Backlog duration:    " << cfg.max_backlog_total_segment_duration() << std::endl;
        }

        CURLSession session;

        // Enabling this will dump HTTP traffic to stdout
        session.set_verbose(cfg.debug());

        if (!cfg.username().empty() && !cfg.password().empty())
        {
            session.set_credentials(cfg.username(), cfg.password());
        }

#pragma clang diagnostic push
#pragma clang diagnostic ignored "-Wmissing-noreturn"

        while (true)
        {
            // First, look for files to upload
            auto paths = find_upload_files(cfg.base_dir(), cfg.extensions());

            if (paths.empty())
            {
                // If we didn't find any files, just sleep a bit and try again later
                std::this_thread::sleep_for(std::chrono::milliseconds(200));
                continue;
            }

            // We've found some files to upload.
            // First, we check a backlog - we'll calculate how many items do we have stored in storage, queued for sending
            // and if it's duration will exceed given threshold, we'll just delete them from filesystem. This algorithm
            // will ensure that once we're not ready for sending for a long period of time, we won't go out of storage
            // space. Default for backlog duration is 300 seconds, that is 5 minutes of video - can be changed by
            // environment variable.
            auto maxBacklogItems = cfg.max_backlog_total_segment_duration() / cfg.segment_duration();

            if (maxBacklogItems > 0)
            {
                while (paths.size() > maxBacklogItems)
                {
                    // Since order is from newest to oldest, pop items from the back - the oldest ones.
                    const auto& path = paths.back();

                    if (cfg.verbose())
                    {
                        std::cout << path.filename() << ": Removing from backlog" << std::endl;
                    }

                    fs::remove(path);

                    paths.pop_back();
                }
            }

            // Now it's time for file upload. Since we know for sure segment's duration, we can estimate how much
            // files from the backlog we can send until new segment arrives. In order to do that we'll keep track of
            // the time that we spent on each individual file, starting with a time pool equals to one segment duration
            // (in microseconds). After each upload, we'll subtract spent time from available time. Once available
            // time is negative, it means we need to refresh our upload file list. Minimal threshold for available
            // time is 10% of initial available time - we don't want to start sending next piece just before remaining
            // time is about to end.
            time_t availableUploadTime = cfg.segment_duration() * 1000000;
            time_t uploadTimeThreshold = availableUploadTime / 10;

            do
            {
                auto filePath = std::move(paths.front());
                paths.pop_front();

                auto fileSize = fs::file_size(filePath);
                time_t uploadTime = 0;

                if (cfg.verbose())
                {
                    std::cout << filePath.filename() << ": Uploading... ";
                    std::cout.flush();
                }

                if (!session.upload_file(filePath, fileSize, cfg.base_url(), uploadTime))
                {
                    if (cfg.debug())
                    {
                        std::cout << "Failed to upload file, breaking from loop." << std::endl;
                    }

                    break;
                }

                // Update time frame we have for uploading files from backlog.
                availableUploadTime -= uploadTime;

                if (cfg.verbose())
                {
                    auto elapsed = uploadTime / 1000000.0f;
                    auto transferSpeed = fileSize / elapsed / 1024.0f;

                    std::cout << "Done. Transfer speed: " << transferSpeed << " kB/s (" << fileSize << " bytes in " << elapsed << " second(s))" << std::endl;

                    if (cfg.debug())
                    {
                        if (availableUploadTime <= uploadTimeThreshold)
                        {
                            std::cout << "No enough time left for current window, refreshing upload file list" << std::endl;
                        }

                        std::cout << filePath.filename() << ": Removing file from disk... ";
                    }
                }

                // Since we've uploaded file to the server, we don't need it any more in the filesystem.
                boost::system::error_code systemError;
                if (!fs::remove(filePath, systemError))
                {
                    if (cfg.verbose())
                    {
                        std::cout << "Failed to remove uploaded file from disk (" << systemError << ")" << std::endl;
                    }
                }
                else
                {
                    if (cfg.debug())
                    {
                        std::cout << "Done" << std::endl;
                    }
                }

                // We'll continue looping until there are files in the backlog and we still have some time left.
            } while (!paths.empty() && availableUploadTime > uploadTimeThreshold);
        }

#pragma clang diagnostic pop

    }
    catch (const std::exception& ex)
    {
        std::cerr << "Exception: " << ex.what() << std::endl;
        exitResult = 1;
    }

    curl_global_cleanup();
    return exitResult;
}